

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O3

void __thiscall Imf_2_5::SampleCountChannel::endEdit(SampleCountChannel *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  size_t *psVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  if ((this->super_ImageChannel)._numPixels == 0) {
    uVar6 = 0;
  }
  else {
    puVar2 = this->_numSamples;
    puVar3 = this->_sampleListSizes;
    psVar4 = this->_sampleListPositions;
    uVar6 = 0;
    uVar7 = 0;
    do {
      uVar1 = puVar2[uVar7];
      uVar8 = 0;
      if (uVar1 != 0) {
        uVar5 = 1;
        do {
          uVar8 = uVar5;
          uVar5 = uVar8 * 2;
        } while (uVar8 < uVar1);
      }
      puVar3[uVar7] = uVar8;
      psVar4[uVar7] = uVar6;
      this->_totalNumSamples = this->_totalNumSamples + (ulong)puVar2[uVar7];
      uVar6 = (ulong)uVar8 + this->_totalSamplesOccupied;
      this->_totalSamplesOccupied = uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->super_ImageChannel)._numPixels);
  }
  this->_sampleBufferSize = (uVar6 >> 1) + uVar6;
  DeepImageLevel::initializeSampleLists((DeepImageLevel *)(this->super_ImageChannel)._level);
  return;
}

Assistant:

void
SampleCountChannel::endEdit ()
{
    try
    {
        _totalNumSamples = 0;
        _totalSamplesOccupied = 0;

        for (size_t i = 0; i < numPixels(); ++i)
        {
            _sampleListSizes[i] = roundListSizeUp (_numSamples[i]);
            _sampleListPositions[i] = _totalSamplesOccupied;
            _totalNumSamples += _numSamples[i];
            _totalSamplesOccupied += _sampleListSizes[i];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel().initializeSampleLists();
    }
    catch (...)
    {
        level().image().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}